

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O2

int CfdInitializeBlockHandle(void *handle,int network_type,char *block_hex,void **block_handle)

{
  bool bVar1;
  NetType NVar2;
  void *pvVar3;
  Block *this;
  CfdException *pCVar4;
  bool is_bitcoin;
  allocator local_51;
  undefined1 local_50 [32];
  
  cfd::Initialize();
  if (block_handle == (void **)0x0) {
    local_50._0_8_ = "cfdcapi_block.cpp";
    local_50._8_4_ = 0x54;
    local_50._16_8_ = "CfdInitializeBlockHandle";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_50,"block_handle is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_50,"Failed to parameter. block_handle is null.",
               (allocator *)&is_bitcoin);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_50);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(block_hex);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_50,"BlockOpe",(allocator *)&is_bitcoin);
    pvVar3 = cfd::capi::AllocBuffer((string *)local_50,0x20);
    std::__cxx11::string::~string((string *)local_50);
    is_bitcoin = false;
    NVar2 = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
    *(NetType *)((long)pvVar3 + 0x10) = NVar2;
    if (is_bitcoin == true) {
      this = (Block *)operator_new(0xa8);
      std::__cxx11::string::string((string *)local_50,block_hex,&local_51);
      cfd::core::Block::Block(this,(string *)local_50);
      *(Block **)((long)pvVar3 + 0x18) = this;
      std::__cxx11::string::~string((string *)local_50);
      *block_handle = pvVar3;
      return 0;
    }
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)local_50,"Elements is not supported.",&local_51);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_50);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_50._0_8_ = "cfdcapi_block.cpp";
  local_50._8_4_ = 0x5a;
  local_50._16_8_ = "CfdInitializeBlockHandle";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_50,"block_hex is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_50,"Failed to parameter. block_hex is null or empty.",
             (allocator *)&is_bitcoin);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeBlockHandle(
    void* handle, int network_type, const char* block_hex,
    void** block_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiBlockData* buffer = nullptr;
  try {
    cfd::Initialize();
    if (block_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "block_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. block_handle is null.");
    }
    if (IsEmptyString(block_hex)) {
      warn(CFD_LOG_SOURCE, "block_hex is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. block_hex is null or empty.");
    }

    buffer = static_cast<CfdCapiBlockData*>(
        AllocBuffer(kPrefixBlock, sizeof(CfdCapiBlockData)));

    bool is_bitcoin = false;
    buffer->net_type = ConvertNetType(network_type, &is_bitcoin);
    if (is_bitcoin) {
      buffer->block = new Block(std::string(block_hex));
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    *block_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  if (buffer != nullptr) CfdFreeBlockHandle(handle, buffer);
  return result;
}